

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_cbor.hpp
# Opt level: O0

type * jsoncons::cbor::decode_cbor<(anonymous_namespace)::ns::Person>
                 (istream *is,cbor_decode_options *options)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  ser_context *column;
  ser_context *psVar3;
  allocator_type *in_RDX;
  temp_allocator_type *in_RSI;
  basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RDI;
  error_code ec;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> cursor;
  Person *val;
  basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_fffffffffffffaf0;
  allocator<char> *in_stack_fffffffffffffb18;
  error_code *line;
  cbor_decode_options *in_stack_fffffffffffffb20;
  ser_error *this;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb28;
  allocator<char> *paVar4;
  basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this_00;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *this_01;
  error_code local_488;
  allocator<char> local_472;
  allocator<char> local_471 [9];
  error_code *in_stack_fffffffffffffb98;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffffba0;
  basic_staj_cursor<char> *in_stack_fffffffffffffba8;
  undefined1 local_3d9 [985];
  
  this_01 = (json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
             *)local_3d9;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_cbor_cursor<std::istream&>
            (this_00,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  std::allocator<char>::~allocator((allocator<char> *)local_3d9);
  this = (ser_error *)local_471;
  std::allocator<char>::allocator();
  paVar4 = &local_472;
  std::allocator<char>::allocator();
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(this_01,in_RDX,in_RSI);
  std::allocator<char>::~allocator(&local_472);
  std::allocator<char>::~allocator(local_471);
  line = &local_488;
  std::error_code::error_code((error_code *)in_stack_fffffffffffffaf0);
  decode_traits<(anonymous_namespace)::ns::Person,char,void>::
  decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  bVar1 = std::error_code::operator_cast_to_bool(&local_488);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x58);
    column = basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
             context((basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                      *)(local_3d9 + 1));
    (*column->_vptr_ser_context[2])();
    psVar3 = basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
             context((basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                      *)(local_3d9 + 1));
    (*psVar3->_vptr_ser_context[3])();
    ec_00._M_cat = (error_category *)this_00;
    ec_00._0_8_ = paVar4;
    ser_error::ser_error(this,ec_00,(size_t)line,(size_t)column);
    __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
  }
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::~json_decoder((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                   *)in_stack_fffffffffffffaf0);
  basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
  ~basic_cbor_cursor(in_stack_fffffffffffffaf0);
  return (type *)in_RDI;
}

Assistant:

typename std::enable_if<!ext_traits::is_basic_json<T>::value,T>::type 
    decode_cbor(std::istream& is, 
                const cbor_decode_options& options = cbor_decode_options())
    {
        basic_cbor_cursor<binary_stream_source> cursor(is, options);
        json_decoder<basic_json<char,sorted_policy>> decoder{};

        std::error_code ec;
        T val = decode_traits<T,char>::decode(cursor, decoder, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec, cursor.context().line(), cursor.context().column()));
        }
        return val;
    }